

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

float __thiscall cnn::Model::gradient_l2_norm(Model *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  float *pfVar5;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [64];
  
  if (this->gradient_norm_scratch == (float *)0x0) {
    pfVar5 = (float *)cnn_mm_malloc((long)(this->all_params).
                                          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->all_params).
                                          super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 1,0x100);
    this->gradient_norm_scratch = pfVar5;
  }
  ppPVar1 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar2 = (this->all_params).
            super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  lVar8 = 0;
  for (lVar7 = 0; (pointer)((long)ppPVar1 + lVar7) != ppPVar2; lVar7 = lVar7 + 8) {
    plVar3 = *(long **)((long)ppPVar1 + lVar6 * 2);
    (**(code **)(*plVar3 + 0x10))(plVar3,(long)this->gradient_norm_scratch + lVar6);
    lVar8 = lVar8 + -1;
    lVar6 = lVar6 + 4;
  }
  auVar9 = ZEXT1664(ZEXT816(0) << 0x40);
  for (lVar6 = 0; -lVar6 != lVar8; lVar6 = lVar6 + 1) {
    auVar9 = ZEXT864((ulong)(auVar9._0_8_ + (double)this->gradient_norm_scratch[lVar6]));
  }
  auVar4 = vsqrtsd_avx(auVar9._0_16_,auVar9._0_16_);
  return (float)auVar4._0_8_;
}

Assistant:

float Model::gradient_l2_norm() const {
  if (!gradient_norm_scratch)
    gradient_norm_scratch = (float*)cnn_mm_malloc(all_params.size() * sizeof(float), 256);
  int pi = 0;
  for (auto p : all_params) {
    p->g_squared_l2norm(&gradient_norm_scratch[pi]);
    ++pi;
  }
#if HAVE_CUDA
  float res = 0;
  gpu::l2_norm_reducer(all_params.size(), gradient_norm_scratch, gradient_norm_scratch, false, false);
  cudaMemcpy(&res, gradient_norm_scratch, sizeof(float),  cudaMemcpyDeviceToHost);
  return sqrt(res);
#else
  double gg = 0;
  for (int i = 0; i < pi; ++i)
    gg += gradient_norm_scratch[i];
  return sqrt(gg);
#endif
}